

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar uVar7;
  size_t sVar8;
  uchar uVar9;
  byte *pbVar10;
  ushort uVar11;
  uchar *puVar12;
  bool bVar13;
  size_t j;
  
  uVar4 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar5 = mode->bitdepth;
    if (uVar5 == 8) {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        uVar7 = in[sVar8];
        puVar12[-1] = uVar7;
        puVar12[-2] = uVar7;
        puVar12[-3] = uVar7;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -(mode->key_r != (uint)in[sVar8]);
          }
          *puVar12 = uVar7;
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    else if (uVar5 == 0x10) {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        uVar7 = in[sVar8 * 2];
        puVar12[-1] = uVar7;
        puVar12[-2] = uVar7;
        puVar12[-3] = uVar7;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -((uint)(ushort)(*(ushort *)(in + sVar8 * 2) << 8 |
                                    *(ushort *)(in + sVar8 * 2) >> 8) != mode->key_r);
          }
          *puVar12 = uVar7;
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    else {
      puVar12 = buffer + 3;
      j = 0;
      while (bVar13 = numpixels != 0, numpixels = numpixels - 1, bVar13) {
        uVar6 = readBitsFromReversedStream(&j,in,(ulong)mode->bitdepth);
        uVar7 = (uchar)((uVar6 * 0xff) / (uint)~(-1 << (uVar5 & 0x1f)));
        puVar12[-1] = uVar7;
        puVar12[-2] = uVar7;
        puVar12[-3] = uVar7;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -(uVar6 != mode->key_r);
          }
          *puVar12 = uVar7;
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      pbVar10 = in + 2;
      puVar12 = buffer + 3;
      while (bVar13 = numpixels != 0, numpixels = numpixels - 1, bVar13) {
        bVar1 = pbVar10[-2];
        puVar12[-3] = bVar1;
        bVar2 = pbVar10[-1];
        puVar12[-2] = bVar2;
        bVar3 = *pbVar10;
        puVar12[-1] = bVar3;
        if (has_alpha != 0) {
          uVar7 = 0xff;
          if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
             (mode->key_g == (uint)bVar2)) {
            uVar7 = -(mode->key_b != (uint)bVar3);
          }
          *puVar12 = uVar7;
        }
        pbVar10 = pbVar10 + 3;
        puVar12 = puVar12 + uVar4;
      }
    }
    else {
      puVar12 = buffer + 3;
      while (bVar13 = numpixels != 0, numpixels = numpixels - 1, bVar13) {
        puVar12[-3] = *in;
        puVar12[-2] = in[2];
        uVar7 = in[4];
        puVar12[-1] = uVar7;
        if (has_alpha != 0) {
          uVar9 = 0xff;
          if (((mode->key_defined != 0) &&
              (uVar11 = swap_bytes(*(undefined2 *)in), (uint)uVar11 == mode->key_r)) &&
             (uVar11 = swap_bytes(*(undefined2 *)(in + 2)), (uint)uVar11 == mode->key_g)) {
            uVar9 = -((uint)CONCAT11(uVar7,in[5]) != mode->key_b);
          }
          *puVar12 = uVar9;
        }
        in = in + 6;
        puVar12 = puVar12 + uVar4;
      }
    }
    break;
  case LCT_PALETTE:
    puVar12 = buffer + 3;
    j = 0;
    for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
      if ((ulong)mode->bitdepth == 8) {
        uVar5 = (uint)in[sVar8];
      }
      else {
        uVar5 = readBitsFromReversedStream(&j,in,(ulong)mode->bitdepth);
      }
      if ((ulong)uVar5 < mode->palettesize) {
        uVar5 = uVar5 << 2;
        puVar12[-3] = mode->palette[uVar5];
        puVar12[-2] = mode->palette[(ulong)uVar5 + 1];
        puVar12[-1] = mode->palette[(ulong)uVar5 + 2];
        if (has_alpha != 0) {
          uVar7 = mode->palette[(ulong)uVar5 + 3];
LAB_004bbb3c:
          *puVar12 = uVar7;
        }
      }
      else {
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        uVar7 = 0xff;
        puVar12[-1] = '\0';
        if (has_alpha != 0) goto LAB_004bbb3c;
      }
      puVar12 = puVar12 + uVar4;
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        uVar7 = in[sVar8 * 2];
        puVar12[-1] = uVar7;
        puVar12[-2] = uVar7;
        puVar12[-3] = uVar7;
        if (has_alpha != 0) {
          *puVar12 = in[sVar8 * 2 + 1];
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    else {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        uVar7 = in[sVar8 * 4];
        puVar12[-1] = uVar7;
        puVar12[-2] = uVar7;
        puVar12[-3] = uVar7;
        if (has_alpha != 0) {
          *puVar12 = in[sVar8 * 4 + 2];
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        puVar12[-3] = in[sVar8 * 4];
        puVar12[-2] = in[sVar8 * 4 + 1];
        puVar12[-1] = in[sVar8 * 4 + 2];
        if (has_alpha != 0) {
          *puVar12 = in[sVar8 * 4 + 3];
        }
        puVar12 = puVar12 + uVar4;
      }
    }
    else {
      puVar12 = buffer + 3;
      for (sVar8 = 0; numpixels != sVar8; sVar8 = sVar8 + 1) {
        puVar12[-3] = in[sVar8 * 8];
        puVar12[-2] = in[sVar8 * 8 + 2];
        puVar12[-1] = in[sVar8 * 8 + 4];
        if (has_alpha != 0) {
          *puVar12 = in[sVar8 * 8 + 6];
        }
        puVar12 = puVar12 + uVar4;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
                                unsigned has_alpha, const unsigned char* in,
                                const LodePNGColorMode* mode)
{
  unsigned num_channels = has_alpha ? 4 : 3;
  size_t i;
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        if(has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
      }
    }
    else if(mode->bitdepth == 16)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        if(has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        if(has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 3 + 0];
        buffer[1] = in[i * 3 + 1];
        buffer[2] = in[i * 3 + 2];
        if(has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
           && buffer[1]== mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        if(has_alpha) buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    size_t j = 0;
    for(i = 0; i != numpixels; ++i, buffer += num_channels)
    {
      if(mode->bitdepth == 8) index = in[i];
      else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

      if(index >= mode->palettesize)
      {
        /*This is an error according to the PNG spec, but most PNG decoders make it black instead.
        Done here too, slightly faster due to no error handling needed.*/
        buffer[0] = buffer[1] = buffer[2] = 0;
        if(has_alpha) buffer[3] = 255;
      }
      else
      {
        buffer[0] = mode->palette[index * 4 + 0];
        buffer[1] = mode->palette[index * 4 + 1];
        buffer[2] = mode->palette[index * 4 + 2];
        if(has_alpha) buffer[3] = mode->palette[index * 4 + 3];
      }
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        if(has_alpha) buffer[3] = in[i * 2 + 1];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        if(has_alpha) buffer[3] = in[i * 4 + 2];
      }
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 4 + 0];
        buffer[1] = in[i * 4 + 1];
        buffer[2] = in[i * 4 + 2];
        if(has_alpha) buffer[3] = in[i * 4 + 3];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        if(has_alpha) buffer[3] = in[i * 8 + 6];
      }
    }
  }
}